

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O1

void INT_CMCondition_signal(CManager cm,int condition)

{
  CMControlList p_Var1;
  int iVar2;
  CMControlList extraout_RDX;
  CMControlList cl;
  CMControlList extraout_RDX_00;
  CMCondition cond;
  
  p_Var1 = cm->control_list;
  iVar2 = CManager_locked(cm);
  if (iVar2 == 0) {
    puts("Not LOCKED!");
  }
  set_debug_flag(cm);
  cond = (CMCondition)&p_Var1->condition_list;
  do {
    cond = cond->next;
    if (cond == (CMCondition)0x0) {
      cond = (CMCondition)0x0;
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n",
              condition);
      cl = extraout_RDX_00;
      break;
    }
    cl = extraout_RDX;
  } while (cond->condition_num != condition);
  if (cond != (CMCondition)0x0) {
    cond->signaled = 1;
    CMCondition_trigger(cm,cond,cl);
    if (p_Var1->has_thread == 0) {
      cm->abort_read_ahead = 1;
    }
    if (p_Var1->cond_polling != 0) {
      CMwake_server_thread(cm);
      return;
    }
  }
  return;
}

Assistant:

extern void
INT_CMCondition_signal(CManager cm, int condition)
{
    CMCondition cond;
    CMControlList cl = cm->control_list;
    if(!CManager_locked(cm)) {
	printf("Not LOCKED!\n");
    }
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->signaled = 1;
    CMCondition_trigger(cm, cond, cl);
    if (cl->has_thread == 0) cm->abort_read_ahead = 1;
    if (cl->cond_polling) {
	/* wake the server thread in case we're not him */
	CMwake_server_thread(cm);
    }
}